

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetUndefinedValue(JsValueRef *undefinedValue)

{
  JsErrorCode JVar1;
  JsValueRef *local_10;
  JsValueRef *undefinedValue_local;
  
  local_10 = undefinedValue;
  JVar1 = ContextAPINoScriptWrapper_NoRecord<JsGetUndefinedValue::__0>
                    ((anon_class_8_1_fbaef43f)&local_10,true,false);
  return JVar1;
}

Assistant:

CHAKRA_API JsGetUndefinedValue(_Out_ JsValueRef *undefinedValue)
{
    return ContextAPINoScriptWrapper_NoRecord([&] (Js::ScriptContext *scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(undefinedValue);

        *undefinedValue = scriptContext->GetLibrary()->GetUndefined();

        return JsNoError;
    },
    /*allowInObjectBeforeCollectCallback*/true);
}